

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O2

void ncnn::transpose(Mat *X,Mat *XT,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined4 *puVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 *puVar8;
  int j;
  ulong uVar9;
  
  uVar1 = X->w;
  uVar2 = X->h;
  puVar3 = (undefined4 *)X->data;
  pvVar4 = XT->data;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
    puVar8 = puVar3;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined4 *)((long)pvVar4 + uVar9 * 4) = *puVar8;
      puVar8 = puVar8 + (int)uVar1;
    }
    pvVar4 = (void *)((long)pvVar4 + (long)(int)uVar2 * 4);
    puVar3 = puVar3 + 1;
  }
  return;
}

Assistant:

static void transpose(const Mat& X, Mat& XT, const Option& opt)
{
    const int w = X.w;
    const int h = X.h;

    const float* pX = X;
    float* pXT = XT;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < w; i++)
    {
        float* ptr = pXT + i * h;
        for (int j = 0; j < h; j++)
        {
            ptr[j] = pX[j * w + i];
        }
    }
}